

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall
HModel::util_getRowBounds(HModel *this,int firstrow,int lastrow,double *XrowLower,double *XrowUpper)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  long lVar4;
  int row;
  long lVar5;
  double dVar6;
  
  lVar4 = (long)firstrow;
  pdVar1 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->rowScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar5 = 0; lVar4 + lVar5 <= (long)lastrow; lVar5 = lVar5 + 1) {
    if (XrowLower != (double *)0x0) {
      dVar6 = pdVar1[lVar4 + lVar5];
      if (-1e+200 < dVar6) {
        dVar6 = dVar6 * pdVar2[lVar4 + lVar5];
      }
      XrowLower[lVar5] = dVar6;
    }
    if (XrowUpper != (double *)0x0) {
      dVar6 = pdVar3[lVar4 + lVar5];
      if (dVar6 < 1e+200) {
        dVar6 = dVar6 * pdVar2[lVar4 + lVar5];
      }
      XrowUpper[lVar5] = dVar6;
    }
  }
  return;
}

Assistant:

void HModel::util_getRowBounds(int firstrow, int lastrow, double* XrowLower, double* XrowUpper) {
  assert(0 <= firstrow);
  assert(firstrow <= lastrow);
  assert(lastrow < numRow);
  for (int row = firstrow; row <= lastrow; ++row) {
    if (XrowLower != NULL)
      XrowLower[row-firstrow] = (hsol_isInfinity(-rowLower[row]) ? rowLower[row]
				 : rowLower[row] * rowScale[row]);
    if (XrowUpper != NULL)
      XrowUpper[row-firstrow] = (hsol_isInfinity(rowUpper[row]) ? rowUpper[row]
				 : rowUpper[row] * rowScale[row]);
  }
}